

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim2.c
# Opt level: O2

int Gia_Sim2HashKey(uint *pSim,int nWords,int nTableSize)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = 0;
  uVar3 = (ulong)(uint)nWords;
  if (nWords < 1) {
    uVar3 = 0;
  }
  if ((*pSim & 1) == 0) {
    for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      uVar1 = uVar1 ^ Gia_Sim2HashKey::s_Primes[(uint)uVar2 & 0xf] * pSim[uVar2];
    }
  }
  else {
    for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      uVar1 = uVar1 ^ ~pSim[uVar2] * Gia_Sim2HashKey::s_Primes[(uint)uVar2 & 0xf];
    }
  }
  return uVar1 % (uint)nTableSize;
}

Assistant:

int Gia_Sim2HashKey( unsigned * pSim, int nWords, int nTableSize )
{
    static int s_Primes[16] = { 
        1291, 1699, 1999, 2357, 2953, 3313, 3907, 4177, 
        4831, 5147, 5647, 6343, 6899, 7103, 7873, 8147 };
    unsigned uHash = 0;
    int i;
    if ( pSim[0] & 1 )
        for ( i = 0; i < nWords; i++ )
            uHash ^= ~pSim[i] * s_Primes[i & 0xf];
    else
        for ( i = 0; i < nWords; i++ )
            uHash ^= pSim[i] * s_Primes[i & 0xf];
    return (int)(uHash % nTableSize);

}